

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering_Equality.cpp
# Opt level: O0

Result __thiscall
Kernel::Ordering::compare_s1It1(Ordering *this,TermList s1,TermList s2,TermList t1,TermList t2)

{
  int iVar1;
  Result r;
  TermList in_RCX;
  TermList in_RDX;
  TermList in_RSI;
  long *in_RDI;
  TermList in_R8;
  undefined4 in_stack_ffffffffffffff58;
  TermList in_stack_ffffffffffffff60;
  TermList in_stack_ffffffffffffff68;
  TermList in_stack_ffffffffffffff70;
  TermList in_stack_ffffffffffffff78;
  Ordering *in_stack_ffffffffffffffa8;
  TermList in_stack_ffffffffffffffb0;
  TermList in_stack_ffffffffffffffb8;
  TermList s2_00;
  TermList s1_00;
  undefined4 local_4;
  
  s2_00._content = in_R8._content;
  s1_00._content = in_RDX._content;
  iVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RDX._content,in_R8._content);
  if (iVar1 == 1) {
    local_4 = compare_s1Gt1_s2It2((Ordering *)CONCAT44(1,in_stack_ffffffffffffff58),
                                  in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                  in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  }
  else if (iVar1 == 2) {
    r = compare_s1Gt1_s2It2((Ordering *)CONCAT44(2,in_stack_ffffffffffffff58),in_R8,in_RCX,in_RDX,
                            in_RSI);
    local_4 = reverse(r);
  }
  else {
    local_4 = compare_s1It1_s2It2(in_stack_ffffffffffffffa8,s1_00,s2_00,in_stack_ffffffffffffffb8,
                                  in_stack_ffffffffffffffb0);
  }
  return local_4;
}

Assistant:

Ordering::Result Ordering::compare_s1It1(TermList s1,TermList s2,TermList t1,TermList t2) const
{
  ASS_EQ(compare(s1,t1), INCOMPARABLE);

  switch(compare(s2,t2)) {
  case GREATER:
    return compare_s1Gt1_s2It2(s2,s1,t2,t1);
  case INCOMPARABLE:
    return compare_s1It1_s2It2(s1,s2,t1,t2);
  case LESS:
    return reverse(compare_s1Gt1_s2It2(t2,t1,s2,s1));
  default:
    ASSERTION_VIOLATION;
  }
}